

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O2

void __thiscall duckdb::Binder::PopExpressionBinder(Binder *this)

{
  pointer *pprVar1;
  vector<std::reference_wrapper<duckdb::ExpressionBinder>,_true> *pvVar2;
  
  pvVar2 = GetActiveBinders(this);
  pprVar1 = &(pvVar2->
             super_vector<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
             ).
             super__Vector_base<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *pprVar1 = *pprVar1 + -1;
  return;
}

Assistant:

void Binder::PopExpressionBinder() {
	D_ASSERT(HasActiveBinder());
	GetActiveBinders().pop_back();
}